

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

void __thiscall testing::Message::Message(Message *this,Message *msg)

{
  stringstream *this_00;
  String SStack_28;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  (this->ss_).ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
  GetString((Message *)&SStack_28);
  internal::operator<<((ostream *)(this_00 + 0x10),&SStack_28);
  internal::String::~String(&SStack_28);
  return;
}

Assistant:

Message(const Message& msg) : ss_(new ::std::stringstream) {  // NOLINT
    *ss_ << msg.GetString();
  }